

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O1

void __thiscall
llvm::ErrorOr<std::__cxx11::string>::moveConstruct<std::__cxx11::string>
          (ErrorOr<std::__cxx11::string> *this,
          ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Other)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  
  if ((Other->field_0x20 & 1) == 0) {
    this[0x20] = (ErrorOr<std::__cxx11::string>)((byte)this[0x20] & 0xfe);
    if ((Other->field_0x20 & 1) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::basic_string<char>>::getStorage() [T = std::basic_string<char>]"
                   );
    }
    *(ErrorOr<std::__cxx11::string> **)this = this + 0x10;
    puVar1 = (undefined8 *)((long)&Other->field_0 + 0x10);
    if (*(undefined8 **)&Other->field_0 == puVar1) {
      uVar2 = *(undefined8 *)((long)&Other->field_0 + 0x18);
      *(undefined8 *)(this + 0x10) = *puVar1;
      *(undefined8 *)(this + 0x18) = uVar2;
    }
    else {
      *(undefined8 **)this = *(undefined8 **)&Other->field_0;
      *(undefined8 *)(this + 0x10) = *puVar1;
    }
    *(undefined8 *)(this + 8) = *(undefined8 *)((long)&Other->field_0 + 8);
    *(undefined8 **)&Other->field_0 = puVar1;
    *(undefined8 *)((long)&Other->field_0 + 8) = 0;
    (Other->field_0).TStorage.super_AlignedCharArray<8UL,_32UL>.buffer[0x10] = '\0';
  }
  else {
    this[0x20] = (ErrorOr<std::__cxx11::string>)((byte)this[0x20] | 1);
    if ((Other->field_0x20 & 1) == 0) {
      uVar3 = 0;
      uVar2 = std::_V2::system_category();
    }
    else {
      uVar3 = *(undefined4 *)&Other->field_0;
      uVar2 = *(undefined8 *)((long)&Other->field_0 + 8);
    }
    *(undefined4 *)this = uVar3;
    *(undefined8 *)(this + 8) = uVar2;
  }
  return;
}

Assistant:

void moveConstruct(ErrorOr<OtherT> &&Other) {
    if (!Other.HasError) {
      // Get the other value.
      HasError = false;
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    } else {
      // Get other's error.
      HasError = true;
      new (getErrorStorage()) std::error_code(Other.getError());
    }
  }